

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int sign_fromfile(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len,
                 void **abstract)

{
  int iVar1;
  void *hostkey_abstract;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  iovec datavec;
  
  iVar1 = file_read_privatekey
                    (session,&privkeyobj,&hostkey_abstract,session->userauth_pblc_method,
                     session->userauth_pblc_method_len,**abstract,*(char **)((long)*abstract + 8));
  if (iVar1 == 0) {
    if (privkeyobj == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
      iVar1 = -1;
    }
    else {
      datavec.iov_base = data;
      datavec.iov_len = data_len;
      iVar1 = (*privkeyobj->signv)(session,sig,sig_len,1,&datavec,&hostkey_abstract);
      iVar1 = -(uint)(iVar1 != 0);
      if (privkeyobj->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*privkeyobj->dtor)(session,&hostkey_abstract);
      }
    }
  }
  return iVar1;
}

Assistant:

static int
sign_fromfile(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
              const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_file *privkey_file = (struct privkey_file *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = file_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                              session->userauth_pblc_method,
                              session->userauth_pblc_method_len,
                              privkey_file->filename,
                              privkey_file->passphrase);
    if(rc)
        return rc;

    if(!privkeyobj)
        return -1;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)LIBSSH2_UNCONST(data);
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}